

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O3

void embree::sse2::
     feature_adaptive_eval_grid<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
               (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *patch,uint subPatch,
               float *levels,uint x0,uint x1,uint y0,uint y1,uint swidth,uint sheight,float *Px,
               float *Py,float *Pz,float *U,float *V,float *Nx,float *Ny,float *Nz,uint dwidth,
               uint dheight)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  float *Nx_00;
  uint uVar4;
  float *Ny_00;
  int iVar5;
  float *Nz_00;
  uint uVar6;
  FeatureAdaptiveEvalGrid local_98;
  
  if (levels == (float *)0x0) {
    iVar5 = 0;
    uVar6 = 0;
    iVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if (x0 == 0) {
      bVar1 = stitch_col<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,false,y0,y1,sheight - 1,(int)levels[3],Px,Py,Pz,U,V,Nx,Ny,Nz
                         ,0,dwidth,dheight);
      uVar4 = (uint)bVar1;
    }
    iVar5 = 0;
    uVar2 = swidth - 1;
    if (uVar2 == x1) {
      bVar1 = stitch_col<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,true,y0,y1,sheight - 1,(int)levels[1],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         x1 - x0,dwidth,dheight);
      iVar5 = -(uint)bVar1;
    }
    uVar6 = 0;
    if (y0 == 0) {
      bVar1 = stitch_row<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,false,x0,x1,uVar2,(int)*levels,Px,Py,Pz,U,V,Nx,Ny,Nz,0,
                         dwidth,dheight);
      uVar6 = (uint)bVar1;
    }
    iVar3 = 0;
    if (sheight - 1 == y1) {
      bVar1 = stitch_row<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,true,x0,x1,uVar2,(int)levels[2],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         y1 - y0,dwidth,dheight);
      iVar3 = -(uint)bVar1;
    }
  }
  uVar2 = uVar6 * dwidth + uVar4;
  Nx_00 = Nx + uVar2;
  if (Nx == (float *)0x0) {
    Nx_00 = (float *)0x0;
  }
  Ny_00 = Ny + uVar2;
  if (Ny == (float *)0x0) {
    Ny_00 = (float *)0x0;
  }
  Nz_00 = Nz + uVar2;
  if (Nz == (float *)0x0) {
    Nz_00 = (float *)0x0;
  }
  FeatureAdaptiveEvalGrid::FeatureAdaptiveEvalGrid
            (&local_98,patch,subPatch,x0 + uVar4,iVar5 + x1,y0 + uVar6,iVar3 + y1,swidth,sheight,
             Px + uVar2,Py + uVar2,Pz + uVar2,U + uVar2,V + uVar2,Nx_00,Ny_00,Nz_00,dwidth,dheight);
  return;
}

Assistant:

void feature_adaptive_eval_grid (const Patch& patch, unsigned subPatch, const float levels[4],
                                     const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                                     float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dwidth, const unsigned dheight)
    {
      bool sl = false, sr = false, st = false, sb = false;
      if (levels) {
        sl = x0 == 0         && stitch_col<Eval,Patch>(patch,subPatch,0,y0,y1,sheight-1,int(levels[3]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sr = x1 == swidth-1  && stitch_col<Eval,Patch>(patch,subPatch,1,y0,y1,sheight-1,int(levels[1]), Px,Py,Pz,U,V,Nx,Ny,Nz, x1-x0,dwidth,dheight);
        st = y0 == 0         && stitch_row<Eval,Patch>(patch,subPatch,0,x0,x1,swidth-1,int(levels[0]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sb = y1 == sheight-1 && stitch_row<Eval,Patch>(patch,subPatch,1,x0,x1,swidth-1,int(levels[2]), Px,Py,Pz,U,V,Nx,Ny,Nz, y1-y0,dwidth,dheight);
      }
      const unsigned ofs = st*dwidth+sl;
      Eval(patch,subPatch,x0+sl,x1-sr,y0+st,y1-sb, swidth,sheight, Px+ofs,Py+ofs,Pz+ofs,U+ofs,V+ofs,Nx?Nx+ofs:nullptr,Ny?Ny+ofs:nullptr,Nz?Nz+ofs:nullptr, dwidth,dheight);
    }